

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v7::detail::
    parse_nonnegative_int<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&,char>&>
              (char **begin,char *end,
              width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>_&,_char>
              *eh)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  
  uVar3 = 0;
  pcVar1 = *begin;
  do {
    pcVar2 = pcVar1 + 1;
    if (0xccccccc < uVar3) {
      uVar3 = 0x80000000;
      goto LAB_0015a67e;
    }
    uVar3 = (uVar3 * 10 + (int)*pcVar1) - 0x30;
    *begin = pcVar2;
  } while ((pcVar2 != end) && (pcVar1 = pcVar2, (byte)(*pcVar2 - 0x30U) < 10));
  if ((int)uVar3 < 0) {
LAB_0015a67e:
    width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>_&,_char>
    ::on_error(eh,"number is too big");
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}